

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QStringView qvariant_cast<QStringView>(QVariant *v)

{
  QStringView QVar1;
  bool bVar2;
  int iVar3;
  QMetaType to;
  QMetaType from;
  undefined8 *puVar4;
  QStringView *pQVar5;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QMetaType targetType;
  QStringView t;
  QMetaType in_stack_00000070;
  QMetaType in_stack_00000078;
  QVariant *in_stack_ffffffffffffffa8;
  Private *in_stack_ffffffffffffffb0;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  to = QMetaType::fromType<QStringView>();
  from = QVariant::Private::type(in_stack_ffffffffffffffb0);
  bVar2 = operator==((QMetaType *)in_stack_ffffffffffffffb0,(QMetaType *)in_stack_ffffffffffffffa8);
  if (bVar2) {
    if ((in_RDI[3] & 1) == 0) {
      local_18.m_size = *in_RDI;
      local_18.m_data = (storage_type_conflict *)in_RDI[1];
    }
    else {
      iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x72a610);
      if (iVar3 == 1) {
        puVar4 = (undefined8 *)QVariant::PrivateShared::data((PrivateShared *)*in_RDI);
        local_18.m_size = *puVar4;
        local_18.m_data = (storage_type_conflict *)puVar4[1];
      }
      else {
        pQVar5 = QVariant::Private::get<QStringView>((Private *)0x72a63f);
        local_18.m_size = pQVar5->m_size;
        local_18.m_data = pQVar5->m_data;
      }
    }
  }
  else {
    local_18.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_18.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QStringView::QStringView(&local_18);
    QVariant::metaType(in_stack_ffffffffffffffa8);
    QVariant::constData((QVariant *)0x72a68d);
    QMetaType::convert(in_stack_00000078,from.d_ptr,in_stack_00000070,to.d_ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.m_data = local_18.m_data;
    QVar1.m_size = local_18.m_size;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}